

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall HMatrix::compute_matB_vec(HMatrix *this,double *vec,int *base,HVector *result)

{
  double dVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  HVector::clear(result);
  piVar4 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = this->numRow;
  if (0 < (long)iVar9) {
    iVar2 = this->numCol;
    piVar6 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      dVar1 = vec[lVar10];
      if (1e-14 < ABS(dVar1)) {
        iVar12 = base[lVar10];
        if (iVar12 < iVar2) {
          iVar3 = piVar6[iVar12];
          lVar11 = (long)iVar3;
          iVar12 = piVar6[(long)iVar12 + 1];
          if (iVar3 < iVar12) {
            do {
              iVar3 = piVar8[lVar11];
              pdVar5[iVar3] = pdVar7[lVar11] * dVar1 + pdVar5[iVar3];
              lVar11 = lVar11 + 1;
            } while (iVar12 != lVar11);
          }
        }
        else {
          iVar12 = iVar12 - iVar2;
          pdVar5[iVar12] = dVar1 + pdVar5[iVar12];
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar9);
  }
  if (this->numRow < 1) {
    iVar9 = 0;
  }
  else {
    lVar10 = 0;
    iVar9 = 0;
    do {
      if (ABS(pdVar5[lVar10]) <= 1e-14) {
        pdVar5[lVar10] = 0.0;
      }
      else {
        lVar11 = (long)iVar9;
        iVar9 = iVar9 + 1;
        piVar4[lVar11] = (int)lVar10;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->numRow);
  }
  result->count = iVar9;
  return;
}

Assistant:

void HMatrix::compute_matB_vec(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];

    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = vec[i];
        if (fabs(value) > HSOL_CONST_TINY) {
            if (iCol < numCol) {
                for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                    resultArray[Aindex[k]] += value * Avalue[k];
            } else {
                resultArray[iCol - numCol] += value;
            }
        }
    }

    for (int i = 0; i < numRow; i++) {
        if (fabs(resultArray[i]) > HSOL_CONST_TINY) {
            resultIndex[resultCount++] = i;
        } else {
            resultArray[i] = 0;
        }
    }
    result->count = resultCount;
}